

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  int iVar1;
  ptrdiff_t pVar2;
  size_t __n;
  
  while( true ) {
    pVar2 = GetSize(this,ptr);
    iVar1 = (int)pVar2;
    if (size - iVar1 == 0 || size < iVar1) break;
    __n = (size_t)iVar1;
    memcpy(ptr,data,__n);
    data = (void *)((long)data + __n);
    ptr = EnsureSpaceFallback(this,ptr + __n);
    size = size - iVar1;
  }
  memcpy(ptr,data,(long)size);
  return ptr + size;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8_t* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8_t*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}